

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O3

commonNaNT * floatx80ToCommonNaN(commonNaNT *__return_storage_ptr__,floatx80 a,float_status *status)

{
  flag fVar1;
  undefined8 in_RAX;
  commonNaNT *pcVar2;
  uint64_t uVar3;
  bool bVar4;
  
  fVar1 = status->snan_bit_is_one;
  pcVar2 = (commonNaNT *)CONCAT71((int7)((ulong)in_RAX >> 8),fVar1);
  if (fVar1 == '\0') {
    bVar4 = ((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0 &&
            ((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0;
  }
  else {
    bVar4 = ((undefined1  [16])a & (undefined1  [16])0x4000000000000000) != (undefined1  [16])0x0;
  }
  if (((~a._8_4_ & 0x7fff) == 0) && (bVar4)) {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  if ((long)a.low < 0) {
    pcVar2 = (commonNaNT *)((a._8_8_ & 0xffff) >> 0xf);
    __return_storage_ptr__->sign = (flag)pcVar2;
    __return_storage_ptr__->low = 0;
    uVar3 = a.low * 2;
  }
  else {
    if (fVar1 != '\0') {
      __assert_fail("!snan_bit_is_one(status)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat-specialize.inc.c"
                    ,0xc5,"floatx80 floatx80_default_nan_mips64el(float_status *)");
    }
    __return_storage_ptr__->sign = '\x01';
    __return_storage_ptr__->low = 0;
    uVar3 = 0x8000000000000000;
  }
  __return_storage_ptr__->high = uVar3;
  return pcVar2;
}

Assistant:

static commonNaNT floatx80ToCommonNaN(floatx80 a, float_status *status)
{
    floatx80 dflt;
    commonNaNT z;

    if (floatx80_is_signaling_nan(a, status)) {
        float_raise(float_flag_invalid, status);
    }
    if (a.low >> 63) {
        z.sign = a.high >> 15;
        z.low = 0;
        z.high = a.low << 1;
    } else {
        dflt = floatx80_default_nan(status);
        z.sign = dflt.high >> 15;
        z.low = 0;
        z.high = dflt.low << 1;
    }
    return z;
}